

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall GenericModel::setRoleNames(GenericModel *this,QHash<int,_QByteArray> *rNames)

{
  compare_eq_result_container<QHash<int,_QByteArray>,_int,_QByteArray> cVar1;
  int iVar2;
  QModelIndex local_68;
  anon_class_16_2_0b8a94af local_50;
  undefined1 local_40 [8];
  function<void_(const_QModelIndex_&)> sendDataChanged;
  GenericModelPrivate *d;
  QHash<int,_QByteArray> *rNames_local;
  GenericModel *this_local;
  
  sendDataChanged._M_invoker = (_Invoker_type)d_func(this);
  cVar1 = QHash<int,QByteArray>::operator!=
                    ((QHash<int,QByteArray> *)
                     &((GenericModelPrivate *)sendDataChanged._M_invoker)->m_roleNames,rNames);
  if (cVar1) {
    std::function<void_(const_QModelIndex_&)>::function
              ((function<void_(const_QModelIndex_&)> *)local_40);
    local_50.sendDataChanged = (function<void_(const_QModelIndex_&)> *)local_40;
    local_50.this = this;
    std::function<void(QModelIndex_const&)>::operator=
              ((function<void(QModelIndex_const&)> *)local_40,&local_50);
    QHash<int,_QByteArray>::operator=
              ((QHash<int,_QByteArray> *)(sendDataChanged._M_invoker + 0x50),rNames);
    iVar2 = GenericModelItem::rowCount(*(GenericModelItem **)(sendDataChanged._M_invoker + 0x10));
    if ((0 < iVar2) &&
       (iVar2 = GenericModelItem::columnCount
                          (*(GenericModelItem **)(sendDataChanged._M_invoker + 0x10)), 0 < iVar2)) {
      QModelIndex::QModelIndex(&local_68);
      std::function<void_(const_QModelIndex_&)>::operator()
                ((function<void_(const_QModelIndex_&)> *)local_40,&local_68);
    }
    std::function<void_(const_QModelIndex_&)>::~function
              ((function<void_(const_QModelIndex_&)> *)local_40);
  }
  return;
}

Assistant:

void GenericModel::setRoleNames(const QHash<int, QByteArray> &rNames)
{
    Q_D(GenericModel);
    if (d->m_roleNames != rNames) {
        std::function<void(const QModelIndex &)> sendDataChanged;
        sendDataChanged = [this, &sendDataChanged](const QModelIndex &parent) {
            const int rowC = rowCount(parent);
            const int colC = columnCount(parent);
            Q_ASSERT(rowC > 0 && colC > 0);
            for (int r = 0; r < rowC; ++r) {
                for (int c = 0; c < colC; ++c) {
                    const QModelIndex idx = index(r, c, parent);
                    if (hasChildren(idx))
                        sendDataChanged(idx);
                }
            }
            dataChanged(index(0, 0, parent), index(rowC - 1, colC - 1, parent));
        };
        d->m_roleNames = rNames;
        if (d->root->rowCount() > 0 && d->root->columnCount() > 0)
            sendDataChanged(QModelIndex());
    }
}